

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.cpp
# Opt level: O0

CcsProperty * __thiscall
ccs::SearchState::doSearch(SearchState *this,CcsContext *context,string *propertyName)

{
  CcsTracer *pCVar1;
  const_iterator cVar2;
  bool bVar3;
  element_type *this_00;
  pointer ppVar4;
  size_type sVar5;
  reference ppPVar6;
  iterator iVar7;
  iterator iVar8;
  reference ppPVar9;
  vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_> local_e0;
  allocator<const_ccs::CcsProperty_*> local_c1;
  __normal_iterator<const_ccs::Property_**,_std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>_>
  local_c0;
  __normal_iterator<const_ccs::Property_**,_std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>_>
  local_b8;
  undefined1 local_b0 [8];
  vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_> baseValues;
  allocator<const_ccs::Property_*> local_69;
  _Rb_tree_const_iterator<const_ccs::Property_*> local_68;
  _Rb_tree_const_iterator<const_ccs::Property_*> local_60;
  undefined1 local_58 [8];
  vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_> values;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  string *propertyName_local;
  CcsContext *context_local;
  SearchState *this_local;
  
  it._M_node = (_Base_ptr)propertyName;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
       ::find(&this->properties,propertyName);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
       ::end(&this->properties);
  bVar3 = std::operator==(&local_30,&local_38);
  if (bVar3) {
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->parent);
    if (bVar3) {
      this_00 = std::
                __shared_ptr_access<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->parent);
      this_local = (SearchState *)doSearch(this_00,context,(string *)it._M_node);
    }
    else {
      this_local = (SearchState *)0x0;
    }
  }
  else {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>
             ::operator->(&local_30);
    sVar5 = std::
            set<const_ccs::Property_*,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
            ::size(&(ppVar4->second).values);
    if (sVar5 == 1) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>
               ::operator->(&local_30);
      values.super__Vector_base<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    set<const_ccs::Property_*,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
                    ::begin(&(ppVar4->second).values);
      ppPVar6 = std::_Rb_tree_const_iterator<const_ccs::Property_*>::operator*
                          ((_Rb_tree_const_iterator<const_ccs::Property_*> *)
                           &values.
                            super__Vector_base<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local = (SearchState *)*ppPVar6;
    }
    else {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>
               ::operator->(&local_30);
      local_60._M_node =
           (_Base_ptr)
           std::
           set<const_ccs::Property_*,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
           ::begin(&(ppVar4->second).values);
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>
               ::operator->(&local_30);
      local_68._M_node =
           (_Base_ptr)
           std::
           set<const_ccs::Property_*,_std::less<const_ccs::Property_*>,_std::allocator<const_ccs::Property_*>_>
           ::end(&(ppVar4->second).values);
      std::allocator<const_ccs::Property_*>::allocator(&local_69);
      std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>::
      vector<std::_Rb_tree_const_iterator<ccs::Property_const*>,void>
                ((vector<ccs::Property_const*,std::allocator<ccs::Property_const*>> *)local_58,
                 local_60,local_68,&local_69);
      std::allocator<const_ccs::Property_*>::~allocator(&local_69);
      iVar7 = std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>::begin
                        ((vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_> *)
                         local_58);
      iVar8 = std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>::end
                        ((vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_> *)
                         local_58);
      std::
      sort<__gnu_cxx::__normal_iterator<ccs::Property_const**,std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>>,ccs::SearchState::doSearch(ccs::CcsContext_const&,std::__cxx11::string_const&)const::__0>
                (iVar7._M_current,iVar8._M_current);
      local_b8._M_current =
           (Property **)
           std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>::begin
                     ((vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_> *)
                      local_58);
      local_c0._M_current =
           (Property **)
           std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>::end
                     ((vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_> *)
                      local_58);
      std::allocator<const_ccs::CcsProperty_*>::allocator(&local_c1);
      std::vector<ccs::CcsProperty_const*,std::allocator<ccs::CcsProperty_const*>>::
      vector<__gnu_cxx::__normal_iterator<ccs::Property_const**,std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>>,void>
                ((vector<ccs::CcsProperty_const*,std::allocator<ccs::CcsProperty_const*>> *)local_b0
                 ,local_b8,local_c0,&local_c1);
      std::allocator<const_ccs::CcsProperty_*>::~allocator(&local_c1);
      cVar2 = it;
      pCVar1 = this->tracer;
      std::vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>::vector
                (&local_e0,
                 (vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_> *)
                 local_b0);
      (*pCVar1->_vptr_CcsTracer[4])(pCVar1,context,cVar2._M_node,&local_e0);
      std::vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>::~vector
                (&local_e0);
      ppPVar9 = std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>::back
                          ((vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_> *)
                           local_58);
      this_local = (SearchState *)*ppPVar9;
      std::vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>::~vector
                ((vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_> *)
                 local_b0);
      std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>::~vector
                ((vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_> *)local_58);
    }
  }
  return (CcsProperty *)this_local;
}

Assistant:

const CcsProperty *SearchState::doSearch(const CcsContext &context,
    const std::string &propertyName) const {
  auto it = properties.find(propertyName);
  if (it == properties.end()) {
    if (parent) return parent->doSearch(context, propertyName);
    return nullptr;
  }

  if (it->second.values.size() == 1)
    return *it->second.values.begin();

  // it->second.values.size() > 1
  std::vector<const Property *> values(it->second.values.begin(),
      it->second.values.end());
  std::sort(values.begin(), values.end(),
      [](const Property *l, const Property *r) {
    return l->propertyNumber() < r->propertyNumber();
  });

  std::vector<const CcsProperty *> baseValues(values.begin(), values.end());
  tracer.onConflict(context, propertyName, baseValues);
  return values.back();
}